

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O0

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_ra_reported_size_Test::
~rate_adaptive_code_from_colptr_rowIdx_ra_reported_size_Test
          (rate_adaptive_code_from_colptr_rowIdx_ra_reported_size_Test *this)

{
  rate_adaptive_code_from_colptr_rowIdx_ra_reported_size_Test *this_local;
  
  ~rate_adaptive_code_from_colptr_rowIdx_ra_reported_size_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, ra_reported_size) {
    auto H = get_code_big_wra();

    {
        auto H_copy = H;
        H_copy.set_rate(0);
        EXPECT_EQ(H_copy, H);  // set_rate(0) does nothing.

        // rate adapting (5 steps) sets correct reported lengths
        constexpr std::size_t n_line_combs = 5;
        H_copy.set_rate(n_line_combs);
        EXPECT_EQ(H_copy.get_n_rows_after_rate_adaption(), H_copy.get_n_rows_mother_matrix() - n_line_combs);
    }
}